

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

string * format<int,char*>(string *__return_storage_ptr__,int fmt_num,string *fmt,int arg,char *args
                          )

{
  string fmt_replaced;
  string local_40;
  
  format<int>(&local_40,fmt_num,fmt,arg);
  format<char*>(__return_storage_ptr__,fmt_num + 1,&local_40,args);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

const std::string format (int fmt_num, const std::string& fmt, T arg, Args... args)
{
    const std::string fmt_replaced (format (fmt_num, fmt, arg));
    return format (fmt_num+1, fmt_replaced, args...);
}